

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall helics::CommsInterface::disconnect(CommsInterface *this)

{
  bool bVar1;
  ConnectionStatus CVar2;
  CommsInterface *in_RDI;
  CommsInterface *in_stack_00000010;
  string_view in_stack_00000018;
  int cnt;
  undefined8 in_stack_ffffffffffffff98;
  CommsInterface *in_stack_ffffffffffffffa0;
  CommsInterface *in_stack_ffffffffffffffb0;
  int local_3c;
  duration<long,std::ratio<1l,1000l>> local_38 [8];
  milliseconds *in_stack_ffffffffffffffd0;
  TriggerVariable *in_stack_ffffffffffffffd8;
  int local_1c;
  duration<long,std::ratio<1l,1000l>> local_18 [12];
  int local_c;
  
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_RDI);
  if ((!bVar1) && (bVar1 = propertyLock(in_RDI), bVar1)) {
    setRxStatus(in_stack_ffffffffffffffb0,(ConnectionStatus)((ulong)in_RDI >> 0x20));
    setTxStatus(in_stack_ffffffffffffffb0,(ConnectionStatus)((ulong)in_RDI >> 0x20));
    propertyUnLock(in_stack_ffffffffffffffa0);
    join_tx_rx_thread(in_stack_ffffffffffffffb0);
    return;
  }
  std::atomic<bool>::store
            ((atomic<bool> *)in_RDI,SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0),
             (memory_order)in_stack_ffffffffffffffa0);
  CVar2 = std::atomic<helics::CommsInterface::ConnectionStatus>::load(&in_RDI->rxStatus,seq_cst);
  if (CVar2 < RECONNECTING) {
    (*in_RDI->_vptr_CommsInterface[7])();
  }
  CVar2 = std::atomic<helics::CommsInterface::ConnectionStatus>::load(&in_RDI->txStatus,seq_cst);
  if (CVar2 < RECONNECTING) {
    (*in_RDI->_vptr_CommsInterface[6])();
  }
  bVar1 = gmlc::concurrency::TripWireDetector::isTripped((TripWireDetector *)0x4f6be1);
  if (bVar1) {
    setRxStatus(in_stack_ffffffffffffffb0,(ConnectionStatus)((ulong)in_RDI >> 0x20));
    setTxStatus(in_stack_ffffffffffffffb0,(ConnectionStatus)((ulong)in_RDI >> 0x20));
    return;
  }
  local_c = 0;
  while (CVar2 = std::atomic<helics::CommsInterface::ConnectionStatus>::load
                           (&in_RDI->rxStatus,seq_cst), CVar2 < RECONNECTING) {
    in_stack_ffffffffffffffa0 = (CommsInterface *)&in_RDI->rxTrigger;
    local_1c = 800;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_18,&local_1c);
    bVar1 = gmlc::concurrency::TriggerVariable::wait_for
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (!bVar1) {
      local_c = local_c + 1;
      if (local_c % 4 == 0) {
        (*in_RDI->_vptr_CommsInterface[7])();
      }
      if (local_c == 0xe) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
                   (char *)in_RDI);
        logError(in_stack_00000010,in_stack_00000018);
        break;
      }
      bVar1 = gmlc::concurrency::TripWireDetector::isTripped((TripWireDetector *)0x4f6cd0);
      CVar2 = (ConnectionStatus)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (bVar1) {
        std::atomic<helics::CommsInterface::ConnectionStatus>::operator=
                  ((atomic<helics::CommsInterface::ConnectionStatus> *)in_stack_ffffffffffffffa0,
                   CVar2);
        std::atomic<helics::CommsInterface::ConnectionStatus>::operator=
                  ((atomic<helics::CommsInterface::ConnectionStatus> *)in_stack_ffffffffffffffa0,
                   CVar2);
        return;
      }
    }
  }
  local_c = 0;
  do {
    do {
      CVar2 = std::atomic<helics::CommsInterface::ConnectionStatus>::load(&in_RDI->txStatus,seq_cst)
      ;
      if (CONNECTED < CVar2) {
LAB_004f6e08:
        join_tx_rx_thread(in_stack_ffffffffffffffb0);
        return;
      }
      CVar2 = (ConnectionStatus)((ulong)&in_RDI->txTrigger >> 0x20);
      local_3c = 800;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_38,&local_3c);
      bVar1 = gmlc::concurrency::TriggerVariable::wait_for
                        (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    } while (bVar1);
    local_c = local_c + 1;
    if (local_c % 4 == 0) {
      (*in_RDI->_vptr_CommsInterface[6])();
    }
    if (local_c == 0xe) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
                 (char *)in_RDI);
      logError(in_stack_00000010,in_stack_00000018);
      goto LAB_004f6e08;
    }
    bVar1 = gmlc::concurrency::TripWireDetector::isTripped((TripWireDetector *)0x4f6dd2);
    if (bVar1) {
      std::atomic<helics::CommsInterface::ConnectionStatus>::operator=
                ((atomic<helics::CommsInterface::ConnectionStatus> *)in_stack_ffffffffffffffa0,CVar2
                );
      std::atomic<helics::CommsInterface::ConnectionStatus>::operator=
                ((atomic<helics::CommsInterface::ConnectionStatus> *)in_stack_ffffffffffffffa0,CVar2
                );
      return;
    }
  } while( true );
}

Assistant:

void CommsInterface::disconnect()
{
    if (!operating) {
        if (propertyLock()) {
            setRxStatus(ConnectionStatus::TERMINATED);
            setTxStatus(ConnectionStatus::TERMINATED);
            propertyUnLock();
            join_tx_rx_thread();
            return;
        }
    }
    requestDisconnect.store(true, std::memory_order_release);

    if (rxStatus.load() <= ConnectionStatus::CONNECTED) {
        closeReceiver();
    }
    if (txStatus.load() <= ConnectionStatus::CONNECTED) {
        closeTransmitter();
    }
    if (tripDetector.isTripped()) {
        setRxStatus(ConnectionStatus::TERMINATED);
        setTxStatus(ConnectionStatus::TERMINATED);
        return;
    }
    int cnt = 0;
    while (rxStatus.load() <= ConnectionStatus::CONNECTED) {
        if (rxTrigger.wait_for(std::chrono::milliseconds(800))) {
            continue;
        }
        ++cnt;
        if ((cnt % 4) == 0)  // call this every 2400 milliseconds
        {
            // try calling closeReceiver again
            closeReceiver();
        }
        if (cnt == 14)  // Eventually give up
        {
            logError("unable to terminate receiver connection");
            break;
        }
        // check the trip detector
        if (tripDetector.isTripped()) {
            rxStatus = ConnectionStatus::TERMINATED;
            txStatus = ConnectionStatus::TERMINATED;
            return;
        }
    }
    cnt = 0;
    while (txStatus.load() <= ConnectionStatus::CONNECTED) {
        if (txTrigger.wait_for(std::chrono::milliseconds(800))) {
            continue;
        }
        ++cnt;
        if ((cnt % 4) == 0)  // call this every 2400 milliseconds
        {
            // try calling closeTransmitter again
            closeTransmitter();
        }
        if (cnt == 14)  // Eventually give up
        {
            logError("unable to terminate transmit connection");
            break;
        }
        // check the trip detector
        if (tripDetector.isTripped()) {
            rxStatus = ConnectionStatus::TERMINATED;
            txStatus = ConnectionStatus::TERMINATED;
            return;
        }
    }
    join_tx_rx_thread();
}